

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_tiles.cpp
# Opt level: O0

int __thiscall CLayerTiles::BrushGrab(CLayerTiles *this,CLayerGroup *pBrush,CUIRect Rect)

{
  CUIRect Rect_00;
  void *pvVar1;
  CLayerTiles *in_RDI;
  long in_FS_OFFSET;
  int x;
  int y;
  CLayerTiles *pGrabbed;
  RECTi r;
  CLayer *in_stack_ffffffffffffff68;
  CLayerTiles *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar2;
  int local_68;
  int local_3c;
  RECTi local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Rect_00.y = (float)in_stack_ffffffffffffff7c;
  Rect_00.x = (float)in_stack_ffffffffffffff78;
  Rect_00._8_8_ = in_stack_ffffffffffffff80;
  Convert(in_stack_ffffffffffffff70,Rect_00,(RECTi *)in_stack_ffffffffffffff68);
  Clamp(in_RDI,local_28);
  if ((local_28[0].w == 0) || (local_28[0].h == 0)) {
    local_3c = 0;
  }
  else {
    pvVar1 = operator_new(0x80);
    CLayerTiles((CLayerTiles *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    *(CEditor **)((long)pvVar1 + 8) = (in_RDI->super_CLayer).m_pEditor;
    *(int *)((long)pvVar1 + 0x28) = (in_RDI->m_Texture).m_Id;
    *(int *)((long)pvVar1 + 0x30) = in_RDI->m_Image;
    *(int *)((long)pvVar1 + 0x2c) = in_RDI->m_Game;
    CLayerGroup::AddLayer((CLayerGroup *)0x20f40f,in_stack_ffffffffffffff68);
    for (local_68 = 0; local_68 < local_28[0].h; local_68 = local_68 + 1) {
      for (iVar2 = 0; iVar2 < local_28[0].w; iVar2 = iVar2 + 1) {
        *(CTile *)(*(long *)((long)pvVar1 + 0x68) +
                  (long)(local_68 * *(int *)((long)pvVar1 + 0x34) + iVar2) * 4) =
             in_RDI->m_pTiles[(local_28[0].y + local_68) * in_RDI->m_Width + local_28[0].x + iVar2];
      }
    }
    s_lastBrushX = -1;
    s_lastBrushY = -1;
    local_3c = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

int CLayerTiles::BrushGrab(CLayerGroup *pBrush, CUIRect Rect)
{
	RECTi r;
	Convert(Rect, &r);
	Clamp(&r);

	if(!r.w || !r.h)
		return 0;

	// create new layers
	CLayerTiles *pGrabbed = new CLayerTiles(r.w, r.h);
	pGrabbed->m_pEditor = m_pEditor;
	pGrabbed->m_Texture = m_Texture;
	pGrabbed->m_Image = m_Image;
	pGrabbed->m_Game = m_Game;
	pBrush->AddLayer(pGrabbed);

	// copy the tiles
	for(int y = 0; y < r.h; y++)
		for(int x = 0; x < r.w; x++)
			pGrabbed->m_pTiles[y*pGrabbed->m_Width+x] = m_pTiles[(r.y+y)*m_Width+(r.x+x)];

	s_lastBrushX = -1;
	s_lastBrushY = -1;
	return 1;
}